

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

void write_modes_b(AV1_COMP *cpi,ThreadData_conflict *td,TileInfo *tile,aom_writer *w,
                  TokenExtra **tok,TokenExtra *tok_end,int mi_row,int mi_col)

{
  AV1_COMMON *cm;
  MACROBLOCKD *xd_00;
  segmentation *psVar1;
  MB_MODE_INFO **ppMVar2;
  MV_REFERENCE_FRAME *pMVar3;
  uint8_t *puVar4;
  byte bVar5;
  BLOCK_SIZE BVar6;
  _Bool _Var7;
  char cVar8;
  byte bVar9;
  byte bVar10;
  uint8_t uVar11;
  _Bool _Var12;
  BLOCK_SIZE BVar13;
  undefined1 uVar14;
  uint32_t plane;
  FRAME_CONTEXT *pFVar15;
  MB_MODE_INFO *pMVar16;
  FRAME_CONTEXT *pFVar17;
  SequenceHeader *pSVar18;
  ushort uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  aom_bit_depth_t aVar23;
  uint uVar24;
  int_mv iVar25;
  MB_MODE_INFO_EXT_FRAME *pMVar26;
  scale_factors *psVar27;
  ulong uVar28;
  RefCntBuffer *pRVar29;
  RefCntBuffer *pRVar30;
  uint uVar31;
  MB_MODE_INFO *pMVar32;
  ulong uVar33;
  MV *pMVar34;
  aom_cdf_prob (*cdf) [3];
  ulong uVar35;
  aom_cdf_prob (*cdf_00) [9];
  aom_cdf_prob (*cdf_01) [4];
  char cVar36;
  byte bVar37;
  int iVar38;
  nmv_context *nmvc;
  ThreadData_conflict *pTVar39;
  MV_REFERENCE_FRAME ref_frame;
  byte bVar40;
  uint uVar41;
  TX_SIZE tx_size;
  uint uVar42;
  uint uVar43;
  MB_MODE_INFO *pMVar44;
  MB_MODE_INFO *mbmi;
  byte bVar45;
  int blk_col;
  aom_bit_depth_t bit_depth;
  OrderHintInfo *oh;
  int idx;
  uint uVar46;
  TokenExtra *pTVar47;
  long lVar48;
  bool bVar49;
  long lStackY_120;
  MB_MODE_INFO *in_stack_fffffffffffffee8;
  undefined4 uVar51;
  MB_MODE_INFO *pMVar50;
  int in_stack_ffffffffffffff10;
  MB_MODE_INFO *pMVar52;
  ThreadData_conflict *pTVar53;
  ThreadData_conflict *pTVar54;
  MACROBLOCKD *xd;
  uint local_68;
  int_mv ref_mv;
  undefined4 uStack_5c;
  undefined4 local_58;
  ulong local_50;
  ulong local_48;
  TokenExtra **local_40;
  ulong local_38;
  
  uVar51 = (undefined4)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  pFVar15 = (td->mb).e_mbd.tile_ctx;
  iVar21 = (cpi->common).mi_params.mi_stride;
  uVar31 = (uint)tok_end;
  iVar20 = iVar21 * uVar31 + mi_row;
  ppMVar2 = (cpi->common).mi_params.mi_grid_base + iVar20;
  (td->mb).e_mbd.mi = ppMVar2;
  pMVar26 = (cpi->mbmi_ext_info).frame_base +
            ((int)((long)((ulong)(uint)((int)uVar31 >> 0x1f) << 0x20 | (ulong)tok_end & 0xffffffff)
                  / (long)(int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                     [(cpi->common).mi_params.mi_alloc_bsize]) *
             (cpi->mbmi_ext_info).stride +
            mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                [(cpi->common).mi_params.mi_alloc_bsize]);
  (td->mb).mbmi_ext_frame = pMVar26;
  (td->mb).e_mbd.tx_type_map = (cpi->common).mi_params.tx_type_map + iVar20;
  (td->mb).e_mbd.tx_type_map_stride = iVar21;
  pMVar16 = *ppMVar2;
  local_38 = (ulong)pMVar16->bsize;
  bVar37 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[local_38];
  bVar5 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[local_38];
  iVar21 = (cpi->common).mi_params.mi_rows;
  iVar20 = (cpi->common).mi_params.mi_cols;
  (td->mb).e_mbd.mb_to_top_edge = uVar31 * -0x20;
  local_48 = (ulong)bVar37;
  (td->mb).e_mbd.mb_to_bottom_edge = (iVar21 - (bVar37 + uVar31)) * 0x20;
  (td->mb).e_mbd.mb_to_left_edge = mi_row * -0x20;
  (td->mb).e_mbd.mb_to_right_edge = (iVar20 - ((uint)bVar5 + mi_row)) * 0x20;
  (td->mb).e_mbd.mi_row = uVar31;
  (td->mb).e_mbd.mi_col = mi_row;
  iVar21 = tile->mi_row_start;
  (td->mb).e_mbd.up_available = iVar21 < (int)uVar31;
  uVar24 = (td->mb).e_mbd.plane[1].subsampling_x;
  uVar41 = (td->mb).e_mbd.plane[1].subsampling_y;
  iVar20 = tile->mi_col_start;
  (td->mb).e_mbd.chroma_up_available = iVar21 < (int)uVar31;
  (td->mb).e_mbd.left_available = iVar20 < mi_row;
  bVar49 = iVar20 < mi_row + -1;
  if (uVar24 == 0) {
    bVar49 = iVar20 < mi_row;
  }
  if ((0x3efffcUL >> (local_38 & 0x3f) & 1) != 0) {
    bVar49 = iVar20 < mi_row;
  }
  (td->mb).e_mbd.chroma_left_available = bVar49;
  uVar42 = uVar31;
  if ((0x20005UL >> (local_38 & 0x3f) & 1) != 0 && uVar41 != 0) {
    uVar42 = uVar31 - 1;
    (td->mb).e_mbd.chroma_up_available = iVar21 < (int)uVar42;
  }
  if (iVar21 < (int)uVar31) {
    pMVar32 = ppMVar2[-(long)(td->mb).e_mbd.mi_stride];
  }
  else {
    pMVar32 = (MB_MODE_INFO *)0x0;
  }
  (td->mb).e_mbd.above_mbmi = pMVar32;
  if (iVar20 < mi_row) {
    pMVar32 = ppMVar2[-1];
  }
  else {
    pMVar32 = (MB_MODE_INFO *)0x0;
  }
  (td->mb).e_mbd.left_mbmi = pMVar32;
  if ((((ulong)tok_end & 1) == 0) && ((bVar37 & uVar41 != 0) != 0)) {
    (td->mb).e_mbd.is_chroma_ref = false;
  }
  else {
    if (((mi_row & 1U) == 0) && ((bVar5 & 1) != 0)) {
      (td->mb).e_mbd.is_chroma_ref = uVar24 == 0;
      if (uVar24 != 0) goto LAB_0018b7c0;
    }
    else {
      (td->mb).e_mbd.is_chroma_ref = true;
    }
    iVar20 = (td->mb).e_mbd.mi_stride;
    iVar38 = (uVar24 & mi_row) + (uVar41 & uVar31) * iVar20;
    if (iVar21 < (int)uVar42) {
      pMVar32 = ppMVar2[(long)-iVar38 + (long)(int)(uVar24 - iVar20)];
    }
    else {
      pMVar32 = (MB_MODE_INFO *)0x0;
    }
    (td->mb).e_mbd.chroma_above_mbmi = pMVar32;
    if (bVar49 == false) {
      pMVar32 = (MB_MODE_INFO *)0x0;
    }
    else {
      pMVar32 = ppMVar2[(long)-iVar38 + (long)(int)(iVar20 * uVar41) + -1];
    }
    (td->mb).e_mbd.chroma_left_mbmi = pMVar32;
  }
LAB_0018b7c0:
  (td->mb).e_mbd.height = bVar37;
  (td->mb).e_mbd.width = bVar5;
  (td->mb).e_mbd.is_last_vertical_rect = false;
  if ((bVar5 < bVar37) && (((uint)bVar5 + mi_row & bVar37 - 1) == 0)) {
    (td->mb).e_mbd.is_last_vertical_rect = true;
  }
  (td->mb).e_mbd.is_first_horizontal_rect = false;
  if ((bVar37 < bVar5) && ((bVar5 - 1 & uVar31) == 0)) {
    (td->mb).e_mbd.is_first_horizontal_rect = true;
  }
  cm = &cpi->common;
  xd_00 = &(td->mb).e_mbd;
  (td->mb).e_mbd.above_txfm_context = (cpi->common).above_contexts.txfm[tile->tile_row] + mi_row;
  (td->mb).e_mbd.left_txfm_context = (td->mb).e_mbd.left_txfm_context_buffer + (uVar31 & 0x1f);
  pTVar53 = td;
  local_40 = tok;
  if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
    psVar1 = &(cpi->common).seg;
    pMVar32 = *ppMVar2;
    if (((cpi->common).seg.segid_preskip != '\0') && ((cpi->common).seg.update_map != '\0')) {
      in_stack_fffffffffffffee8 =
           (MB_MODE_INFO *)((ulong)in_stack_fffffffffffffee8 & 0xffffffff00000000);
      write_segment_id(cpi,xd_00,pMVar32,w,psVar1,&pFVar15->seg,0);
      pTVar53 = td;
    }
    pMVar52 = (MB_MODE_INFO *)w;
    iVar21 = write_skip(cm,xd_00,(byte)*(undefined2 *)&pMVar32->field_0xa7 & 7,pMVar32,w);
    if (((cpi->common).seg.segid_preskip == '\0') && ((cpi->common).seg.update_map != '\0')) {
      in_stack_fffffffffffffee8 =
           (MB_MODE_INFO *)CONCAT44((int)((ulong)in_stack_fffffffffffffee8 >> 0x20),iVar21);
      write_segment_id(cpi,xd_00,pMVar32,w,psVar1,&pFVar15->seg,iVar21);
    }
    write_cdef(cm,xd_00,w,iVar21);
    write_delta_q_params(cm,xd_00,iVar21,w);
    pMVar50 = pMVar52;
    if (((((cm->current_frame).frame_type & 0xfd) == 0) &&
        ((cpi->common).features.allow_screen_content_tools == true)) &&
       ((cpi->common).features.allow_intrabc != false)) {
      pMVar44 = *(pTVar53->mb).e_mbd.mi;
      uVar19 = *(ushort *)&pMVar44->field_0xa7 >> 7;
      pFVar17 = (pTVar53->mb).e_mbd.tile_ctx;
      aom_write_symbol((aom_writer *)pMVar52,uVar19 & 1,pFVar17->intrabc_cdf,2);
      if ((uVar19 & 1) != 0) {
        _ref_mv = CONCAT44(uStack_5c,pMVar26->ref_mv_stack[0].this_mv.as_int);
        av1_encode_dv((aom_writer *)pMVar52,&pMVar44->mv[0].as_mv,&ref_mv.as_mv,&pFVar17->ndvc);
      }
      if ((pMVar32->field_0xa7 & 0x80) != 0) goto LAB_0018be7e;
    }
    iVar21 = 1;
LAB_0018be74:
    write_intra_prediction_modes(cm,xd_00,iVar21,(aom_writer *)pMVar50);
  }
  else {
    uVar14 = (*ppMVar2)->ref_frame[0];
    cVar36 = (*ppMVar2)->ref_frame[1];
    uVar24 = 1;
    ref_frame = uVar14;
    if ((char)uVar14 < '\x02') {
      ref_frame = '\x01';
    }
    psVar27 = get_ref_scale_factors_const(cm,ref_frame);
    (td->mb).e_mbd.block_ref_scale_factors[0] = psVar27;
    if (cVar36 < '\x02') {
      cVar36 = '\x01';
    }
    psVar27 = get_ref_scale_factors_const(cm,cVar36);
    (td->mb).e_mbd.block_ref_scale_factors[1] = psVar27;
    psVar1 = &(cpi->common).seg;
    pMVar32 = *ppMVar2;
    bVar37 = pMVar32->field_0xa7 & 7;
    if (-1 < (char)pMVar32->field_0xa7) {
      uVar24 = (uint)('\0' < pMVar32->ref_frame[0]);
    }
    BVar6 = pMVar32->bsize;
    bVar45 = pMVar32->mode;
    uVar41 = (uint)(cpi->common).features.allow_high_precision_mv;
    cVar36 = pMVar32->ref_frame[1];
    uVar35 = CONCAT44(uVar51,1);
    write_inter_segment_id(cpi,xd_00,w,psVar1,&pFVar15->seg,0,1);
    local_50 = (ulong)bVar37;
    if (((cpi->common).current_frame.skip_mode_info.skip_mode_flag != 0) &&
       ((psVar1->enabled == '\0' || (((cpi->common).seg.feature_mask[local_50] & 0x40) == 0)))) {
      bVar40 = block_size_high[pMVar32->bsize];
      if (block_size_wide[pMVar32->bsize] < block_size_high[pMVar32->bsize]) {
        bVar40 = block_size_wide[pMVar32->bsize];
      }
      if ((7 < bVar40) &&
         ((psVar1->enabled == '\0' || (((cpi->common).seg.feature_mask[local_50] & 0xa0) == 0)))) {
        pMVar52 = (pTVar53->mb).e_mbd.left_mbmi;
        pMVar50 = (pTVar53->mb).e_mbd.above_mbmi;
        if (pMVar50 == (MB_MODE_INFO *)0x0) {
          uVar28 = 0;
        }
        else {
          uVar28 = (ulong)(*(ushort *)&pMVar50->field_0xa7 >> 6 & 1);
        }
        if (pMVar52 == (MB_MODE_INFO *)0x0) {
          uVar33 = 0;
        }
        else {
          uVar33 = (ulong)(*(ushort *)&pMVar52->field_0xa7 >> 6 & 1);
        }
        aom_write_symbol(w,*(ushort *)&pMVar32->field_0xa7 >> 6 & 1,
                         ((pTVar53->mb).e_mbd.tile_ctx)->skip_mode_cdfs[uVar33 + uVar28],2);
        bVar37 = (byte)local_50;
      }
    }
    pMVar50 = (MB_MODE_INFO *)w;
    if ((pMVar32->field_0xa7 & 0x40) == 0) {
      iVar21 = write_skip(cm,xd_00,bVar37,pMVar32,w);
    }
    else {
      iVar21 = 1;
    }
    in_stack_fffffffffffffee8 = (MB_MODE_INFO *)(uVar35 & 0xffffffff00000000);
    write_inter_segment_id(cpi,xd_00,w,psVar1,&pFVar15->seg,iVar21,0);
    write_cdef(cm,xd_00,w,iVar21);
    write_delta_q_params(cm,xd_00,iVar21,w);
    uVar19 = *(ushort *)&pMVar32->field_0xa7;
    if (((uVar19 & 0x40) == 0) &&
       ((psVar1->enabled == '\0' || (((cpi->common).seg.feature_mask[uVar19 & 7] & 0xa0) == 0)))) {
      iVar21 = av1_get_intra_inter_context(xd_00);
      aom_write_symbol(w,uVar24,((pTVar53->mb).e_mbd.tile_ctx)->intra_inter_cdf[iVar21],2);
      uVar19 = *(ushort *)&pMVar32->field_0xa7;
    }
    if ((uVar19 & 0x40) == 0) {
      if (uVar24 == 0) {
        iVar21 = 0;
        goto LAB_0018be74;
      }
      (pTVar53->mb).e_mbd.neighbors_ref_counts[0] = '\0';
      (pTVar53->mb).e_mbd.neighbors_ref_counts[1] = '\0';
      (pTVar53->mb).e_mbd.neighbors_ref_counts[2] = '\0';
      (pTVar53->mb).e_mbd.neighbors_ref_counts[3] = '\0';
      (pTVar53->mb).e_mbd.neighbors_ref_counts[4] = '\0';
      (pTVar53->mb).e_mbd.neighbors_ref_counts[5] = '\0';
      (pTVar53->mb).e_mbd.neighbors_ref_counts[6] = '\0';
      (pTVar53->mb).e_mbd.neighbors_ref_counts[7] = '\0';
      _Var7 = (pTVar53->mb).e_mbd.left_available;
      if ((pTVar53->mb).e_mbd.up_available == true) {
        pMVar52 = (pTVar53->mb).e_mbd.above_mbmi;
        if ((pMVar52->field_0xa7 & 0x80) != 0 || '\0' < pMVar52->ref_frame[0]) {
          puVar4 = (pTVar53->mb).e_mbd.neighbors_ref_counts + pMVar52->ref_frame[0];
          *puVar4 = *puVar4 + '\x01';
          if (0 < (long)pMVar52->ref_frame[1]) {
            puVar4 = (pTVar53->mb).e_mbd.neighbors_ref_counts + pMVar52->ref_frame[1];
            *puVar4 = *puVar4 + '\x01';
          }
        }
      }
      if (_Var7 != false) {
        pMVar52 = (pTVar53->mb).e_mbd.left_mbmi;
        if ((pMVar52->field_0xa7 & 0x80) != 0 || '\0' < pMVar52->ref_frame[0]) {
          puVar4 = (pTVar53->mb).e_mbd.neighbors_ref_counts + pMVar52->ref_frame[0];
          *puVar4 = *puVar4 + '\x01';
          if (0 < (long)pMVar52->ref_frame[1]) {
            puVar4 = (pTVar53->mb).e_mbd.neighbors_ref_counts + pMVar52->ref_frame[1];
            *puVar4 = *puVar4 + '\x01';
          }
        }
      }
      pMVar52 = *(pTVar53->mb).e_mbd.mi;
      cVar8 = pMVar52->ref_frame[1];
      if ((psVar1->enabled == '\0') ||
         (((cpi->common).seg.feature_mask[*(ushort *)&pMVar52->field_0xa7 & 7] & 0xe0) == 0)) {
        pMVar44 = pMVar50;
        pTVar39 = pTVar53;
        if ((cpi->common).current_frame.reference_mode == '\x02') {
          bVar37 = block_size_high[pMVar52->bsize];
          if (block_size_wide[pMVar52->bsize] < block_size_high[pMVar52->bsize]) {
            bVar37 = block_size_wide[pMVar52->bsize];
          }
          if (7 < bVar37) {
            pFVar17 = (pTVar53->mb).e_mbd.tile_ctx;
            iVar21 = av1_get_reference_mode_context(xd_00);
            aom_write_symbol((aom_writer *)pMVar50,(uint)('\0' < cVar8),
                             pFVar17->comp_inter_cdf[iVar21],2);
            pMVar44 = pMVar50;
            pTVar39 = pTVar53;
          }
        }
        if (cVar8 < '\x01') {
          bVar37 = pMVar52->ref_frame[0] - 5;
          pFVar17 = (pTVar39->mb).e_mbd.tile_ctx;
          pTVar53 = pTVar39;
          iVar21 = av1_get_pred_context_single_ref_p1(xd_00);
          pMVar50 = pMVar44;
          aom_write_symbol((aom_writer *)pMVar44,(uint)(bVar37 < 3),
                           (aom_cdf_prob *)(pFVar17->single_ref_cdf + iVar21),2);
          cVar8 = pMVar52->ref_frame[0];
          if (bVar37 < 3) {
            pFVar17 = (pTVar39->mb).e_mbd.tile_ctx;
            iVar21 = av1_get_pred_context_single_ref_p2(xd_00);
            aom_write_symbol((aom_writer *)pMVar44,(uint)(cVar8 == '\a'),
                             pFVar17->single_ref_cdf[iVar21][1],2);
            if (cVar8 == '\a') goto LAB_0018c99a;
            uVar24 = (uint)(pMVar52->ref_frame[0] == '\x06');
            pFVar17 = (pTVar53->mb).e_mbd.tile_ctx;
            pMVar44 = pMVar50;
            iVar21 = av1_get_pred_context_single_ref_p6(xd_00);
            cdf = pFVar17->single_ref_cdf[iVar21] + 5;
            pMVar50 = pMVar44;
          }
          else {
            pFVar17 = (pTVar39->mb).e_mbd.tile_ctx;
            iVar21 = av1_get_pred_context_single_ref_p3(xd_00);
            aom_write_symbol((aom_writer *)pMVar44,(uint)((byte)(cVar8 - 3U) < 2),
                             pFVar17->single_ref_cdf[iVar21][2],2);
            pFVar17 = (pTVar39->mb).e_mbd.tile_ctx;
            if ((byte)(cVar8 - 3U) < 2) {
              bVar49 = pMVar52->ref_frame[0] != '\x03';
              iVar21 = av1_get_pred_context_single_ref_p5(xd_00);
              cdf = pFVar17->single_ref_cdf[iVar21] + 4;
            }
            else {
              bVar49 = pMVar52->ref_frame[0] != '\x01';
              iVar21 = av1_get_pred_context_single_ref_p4(xd_00);
              cdf = pFVar17->single_ref_cdf[iVar21] + 3;
            }
            uVar24 = (uint)bVar49;
          }
LAB_0018c98e:
          aom_write_symbol((aom_writer *)pMVar44,uVar24,*cdf,2);
        }
        else {
          if (pMVar52->ref_frame[1] < '\x01') {
            uVar24 = 0;
          }
          else {
            uVar24 = (uint)((byte)pMVar52->ref_frame[1] < 5 != '\x04' < pMVar52->ref_frame[0]);
          }
          iVar21 = av1_get_comp_reference_type_context(xd_00);
          pMVar50 = pMVar44;
          pTVar53 = pTVar39;
          aom_write_symbol((aom_writer *)pMVar44,uVar24 ^ 1,
                           ((pTVar39->mb).e_mbd.tile_ctx)->comp_ref_type_cdf[iVar21],2);
          cVar8 = pMVar52->ref_frame[0];
          if (uVar24 == 0) {
            iVar21 = av1_get_pred_context_comp_ref_p(xd_00);
            aom_write_symbol((aom_writer *)pMVar44,(uint)((byte)(cVar8 - 3U) < 2),
                             (aom_cdf_prob *)(((pTVar39->mb).e_mbd.tile_ctx)->comp_ref_cdf + iVar21)
                             ,2);
            if ((byte)(cVar8 - 3U) < 2) {
              bVar49 = pMVar52->ref_frame[0] == '\x04';
              iVar21 = av1_get_pred_context_comp_ref_p2(xd_00);
              lStackY_120 = 2;
              pTVar39 = pTVar53;
            }
            else {
              bVar49 = pMVar52->ref_frame[0] == '\x02';
              iVar21 = av1_get_pred_context_comp_ref_p1(xd_00);
              lStackY_120 = 1;
              pTVar39 = pTVar53;
            }
            pMVar44 = pMVar50;
            pTVar53 = pTVar39;
            aom_write_symbol((aom_writer *)pMVar50,(uint)bVar49,
                             ((pTVar39->mb).e_mbd.tile_ctx)->comp_ref_cdf[iVar21][lStackY_120],2);
            cVar8 = pMVar52->ref_frame[1];
            iVar21 = av1_get_pred_context_comp_bwdref_p(xd_00);
            aom_write_symbol((aom_writer *)pMVar50,(uint)(cVar8 == '\a'),
                             (aom_cdf_prob *)
                             (((pTVar39->mb).e_mbd.tile_ctx)->comp_bwdref_cdf + iVar21),2);
            pMVar50 = pMVar44;
            if (cVar8 != '\a') {
              uVar24 = (uint)(pMVar52->ref_frame[1] == '\x06');
              iVar21 = av1_get_pred_context_comp_bwdref_p1(xd_00);
              cdf = ((pTVar53->mb).e_mbd.tile_ctx)->comp_bwdref_cdf[iVar21] + 1;
              pMVar50 = pMVar44;
              goto LAB_0018c98e;
            }
          }
          else {
            iVar21 = av1_get_pred_context_uni_comp_ref_p(xd_00);
            aom_write_symbol((aom_writer *)pMVar44,(uint)(cVar8 == '\x05'),
                             (aom_cdf_prob *)
                             (((pTVar39->mb).e_mbd.tile_ctx)->uni_comp_ref_cdf + iVar21),2);
            if (cVar8 != '\x05') {
              bVar37 = pMVar52->ref_frame[1] - 3;
              iVar21 = av1_get_pred_context_uni_comp_ref_p1(xd_00);
              aom_write_symbol((aom_writer *)pMVar50,(uint)(bVar37 < 2),
                               ((pTVar53->mb).e_mbd.tile_ctx)->uni_comp_ref_cdf[iVar21][1],2);
              if (bVar37 < 2) {
                uVar24 = (uint)(pMVar52->ref_frame[1] == '\x04');
                pMVar44 = pMVar50;
                iVar21 = av1_get_pred_context_uni_comp_ref_p2(xd_00);
                cdf = ((pTVar53->mb).e_mbd.tile_ctx)->uni_comp_ref_cdf[iVar21] + 2;
                pMVar50 = pMVar44;
                goto LAB_0018c98e;
              }
            }
          }
        }
      }
LAB_0018c99a:
      uVar19 = pMVar26->mode_context;
      if ('\0' < pMVar32->ref_frame[1]) {
        uVar35 = 4;
        if ((ushort)(uVar19 & 7) < 4) {
          uVar35 = (ulong)(uVar19 & 7);
        }
        uVar19 = compound_mode_ctx_map[uVar19 >> 5 & 7][uVar35];
      }
      if ((psVar1->enabled == '\0') || (((cpi->common).seg.feature_mask[local_50] & 0x40) == 0)) {
        bVar37 = bVar45 - 0x11;
        if (bVar37 < 8) {
          cdf_00 = ((pTVar53->mb).e_mbd.tile_ctx)->inter_compound_mode_cdf + (short)uVar19;
          iVar21 = 8;
LAB_0018cae5:
          aom_write_symbol((aom_writer *)pMVar50,(uint)bVar37,*cdf_00,iVar21);
LAB_0018caf0:
          if (((bVar45 & 0xf7) == 0x10) ||
             ((bVar45 < 0x17 && ((0x644000U >> (bVar45 & 0x1f) & 1) != 0)))) {
LAB_0018cb1d:
            bVar37 = pMVar32->mode;
            if (bVar37 < 0x19) {
              if ((0x644000U >> (bVar37 & 0x1f) & 1) == 0) {
                if ((0x1010000U >> (bVar37 & 0x1f) & 1) != 0) {
                  uVar24 = 0;
                  do {
                    do {
                      uVar31 = uVar24;
                      if (uVar31 == 2) goto LAB_0018cc6a;
                      uVar24 = uVar31 + 1;
                    } while (pMVar26->ref_mv_count <= uVar24);
                    bVar37 = av1_drl_ctx(pMVar26->weight,uVar31);
                    aom_write_symbol((aom_writer *)pMVar50,
                                     (uint)(uVar31 != (*(ushort *)&pMVar32->field_0xa7 >> 4 & 3)),
                                     pFVar15->drl_cdf[bVar37],2);
                  } while (uVar31 != (*(ushort *)&pMVar32->field_0xa7 >> 4 & 3));
                }
              }
              else {
                uVar24 = 0;
                do {
                  do {
                    uVar31 = uVar24;
                    if (uVar31 == 2) goto LAB_0018cc6a;
                    uVar24 = uVar31 + 1;
                  } while ((uint)pMVar26->ref_mv_count <= uVar31 + 2);
                  bVar37 = av1_drl_ctx(pMVar26->weight,uVar24);
                  aom_write_symbol((aom_writer *)pMVar50,
                                   (uint)(uVar31 != (*(ushort *)&pMVar32->field_0xa7 >> 4 & 3)),
                                   pFVar15->drl_cdf[bVar37],2);
                } while (uVar31 != (*(ushort *)&pMVar32->field_0xa7 >> 4 & 3));
              }
            }
          }
          goto LAB_0018cc6a;
        }
        if (bVar37 < 0xfc) goto LAB_0018caf0;
        aom_write_symbol((aom_writer *)pMVar50,(uint)(bVar45 != 0x10),pFVar15->newmv_cdf[uVar19 & 7]
                         ,2);
        if (bVar45 == 0x10) goto LAB_0018cb1d;
        aom_write_symbol((aom_writer *)pMVar50,(uint)(bVar45 != 0xf),
                         pFVar15->zeromv_cdf[uVar19 >> 3 & 1],2);
        pTVar39 = pTVar53;
        if (bVar45 != 0xf) {
          bVar37 = bVar45 != 0xd;
          cdf_00 = (aom_cdf_prob (*) [9])(pFVar15->refmv_cdf + (uVar19 >> 4 & 0xf));
          iVar21 = 2;
          goto LAB_0018cae5;
        }
      }
      else {
LAB_0018cc6a:
        uVar51 = (undefined4)((ulong)in_stack_fffffffffffffee8 >> 0x20);
        pTVar39 = pTVar53;
        if ((bVar45 & 0xf7) == 0x10) {
          pMVar34 = (MV *)pMVar32->mv;
          for (lVar48 = 0; uVar51 = (undefined4)((ulong)in_stack_fffffffffffffee8 >> 0x20),
              (ulong)('\0' < cVar36) + 1 != lVar48; lVar48 = lVar48 + 1) {
            iVar25 = get_ref_mv(&pTVar53->mb,(int)lVar48);
            _ref_mv = CONCAT44(uStack_5c,iVar25.as_int);
            in_stack_fffffffffffffee8 = (MB_MODE_INFO *)CONCAT44(uVar51,uVar41);
            av1_encode_mv(cpi,(aom_writer *)pMVar50,pTVar53,pMVar34,&ref_mv.as_mv,&pFVar15->nmvc,
                          uVar41);
            pMVar34 = pMVar34 + 1;
          }
        }
        else {
          if ((bVar45 == 0x15) || (bVar45 == 0x13)) {
            iVar25 = get_ref_mv(&pTVar53->mb,1);
            _ref_mv = CONCAT44(uStack_5c,iVar25.as_int);
            pMVar34 = (MV *)(pMVar32->mv + 1);
          }
          else {
            if ((bVar45 & 0xfd) != 0x14) goto LAB_0018cd4e;
            iVar25 = get_ref_mv(&pTVar53->mb,0);
            _ref_mv = CONCAT44(uStack_5c,iVar25.as_int);
            pMVar34 = (MV *)pMVar32->mv;
          }
          in_stack_fffffffffffffee8 = (MB_MODE_INFO *)CONCAT44(uVar51,uVar41);
          av1_encode_mv(cpi,(aom_writer *)pMVar50,pTVar53,pMVar34,&ref_mv.as_mv,&pFVar15->nmvc,
                        uVar41);
        }
      }
LAB_0018cd4e:
      pTVar53 = pTVar39;
      if (((((cpi->common).current_frame.reference_mode == '\x01') ||
           (((cpi->common).seq_params)->enable_interintra_compound == '\0')) ||
          ((byte)(pMVar32->bsize - BLOCK_32X64) < 0xf9)) ||
         (((byte)(pMVar32->mode - 0x11) < 0xfc || (pMVar32->ref_frame[0] < '\x01')))) {
LAB_0018ce37:
        cVar36 = pMVar32->ref_frame[1];
        pMVar52 = pMVar50;
        if (cVar36 != '\0') goto LAB_0018ce48;
      }
      else {
        cVar36 = pMVar32->ref_frame[1];
        pMVar52 = pMVar50;
        if (cVar36 < '\x01') {
          bVar37 = ""[BVar6];
          aom_write_symbol((aom_writer *)pMVar50,(uint)(cVar36 == '\0'),
                           pFVar15->interintra_cdf[bVar37],2);
          if (((cVar36 == '\0') &&
              (aom_write_symbol((aom_writer *)pMVar50,(uint)pMVar32->interintra_mode,
                                pFVar15->interintra_mode_cdf[bVar37],4),
              0 < av1_wedge_params_lookup[BVar6].wedge_types)) &&
             (aom_write_symbol((aom_writer *)pMVar50,*(ushort *)&pMVar32->field_0xa7 >> 10 & 1,
                               pFVar15->wedge_interintra_cdf[BVar6],2),
             (pMVar32->field_0xa8 & 4) != 0)) {
            aom_write_symbol((aom_writer *)pMVar50,(int)pMVar32->interintra_wedge_index,
                             pFVar15->wedge_idx_cdf[BVar6],0x10);
          }
          goto LAB_0018ce37;
        }
LAB_0018ce48:
        if (((cpi->common).features.switchable_motion_mode == true) &&
           (pMVar32->overlappable_neighbors != '\0')) {
          iVar21 = (pTVar39->mb).e_mbd.cur_frame_force_integer_mv;
          BVar13 = pMVar32->bsize;
          if (iVar21 == 0) {
            bVar37 = block_size_high[BVar13];
            if (block_size_wide[BVar13] < block_size_high[BVar13]) {
              bVar37 = block_size_wide[BVar13];
            }
            if (((1 < (cpi->common).global_motion[pMVar32->ref_frame[0]].wmtype) &&
                ((pMVar32->mode - 0xf & 0xf7) == 0)) && (7 < bVar37)) goto LAB_0018cfa5;
          }
          else {
            bVar37 = block_size_high[BVar13];
            if (block_size_wide[BVar13] < block_size_high[BVar13]) {
              bVar37 = block_size_wide[BVar13];
            }
          }
          if (((7 < bVar37) && (cVar36 < '\0')) && (0xf3 < (byte)(pMVar32->mode - 0x19))) {
            if (((iVar21 == 0) && ((cpi->common).features.allow_warped_motion != false)) &&
               (pMVar32->num_proj_ref != '\0')) {
              psVar27 = (pTVar39->mb).e_mbd.block_ref_scale_factors[0];
              iVar21 = psVar27->x_scale_fp;
              if (((iVar21 != -1) && (iVar20 = psVar27->y_scale_fp, iVar20 != -1)) &&
                 (iVar20 != 0x4000 || iVar21 != 0x4000)) goto LAB_0018cf76;
              bVar37 = pMVar32->motion_mode;
              cdf_01 = ((pTVar39->mb).e_mbd.tile_ctx)->motion_mode_cdf + BVar13;
              iVar21 = 3;
            }
            else {
LAB_0018cf76:
              bVar37 = pMVar32->motion_mode == '\x01';
              cdf_01 = (aom_cdf_prob (*) [4])(((pTVar39->mb).e_mbd.tile_ctx)->obmc_cdf + BVar13);
              iVar21 = 2;
            }
            aom_write_symbol((aom_writer *)pMVar52,(uint)bVar37,*cdf_01,iVar21);
          }
        }
LAB_0018cfa5:
        pMVar50 = pMVar52;
        if ('\0' < pMVar32->ref_frame[1]) {
          bVar37 = block_size_high[BVar6];
          if (block_size_wide[BVar6] < block_size_high[BVar6]) {
            bVar37 = block_size_wide[BVar6];
          }
          if (7 < bVar37) {
            for (uVar24 = 0; uVar24 != 4; uVar24 = uVar24 + 1) {
              if ((1 < uVar24) &&
                 (iVar21 = is_interinter_compound_used((COMPOUND_TYPE)uVar24,BVar6), iVar21 != 0)) {
                if (((cpi->common).seq_params)->enable_masked_compound != '\0') {
                  pMVar50 = (pTVar39->mb).e_mbd.left_mbmi;
                  pMVar44 = (pTVar39->mb).e_mbd.above_mbmi;
                  uVar41 = 0;
                  uVar24 = 0;
                  if (pMVar44 != (MB_MODE_INFO *)0x0) {
                    if (pMVar44->ref_frame[1] < '\x01') {
                      uVar24 = (uint)(pMVar44->ref_frame[0] == '\a') * 3;
                    }
                    else {
                      uVar24 = *(ushort *)&pMVar44->field_0xa7 >> 8 & 1;
                    }
                  }
                  if (pMVar50 != (MB_MODE_INFO *)0x0) {
                    if (pMVar50->ref_frame[1] < '\x01') {
                      uVar41 = (uint)(pMVar50->ref_frame[0] == '\a') * 3;
                    }
                    else {
                      uVar41 = *(ushort *)&pMVar50->field_0xa7 >> 8 & 1;
                    }
                  }
                  uVar35 = 5;
                  if (uVar41 + uVar24 < 5) {
                    uVar35 = (ulong)(uVar41 + uVar24);
                  }
                  aom_write_symbol((aom_writer *)pMVar52,*(ushort *)&pMVar32->field_0xa7 >> 8 & 1,
                                   pFVar15->comp_group_idx_cdf[uVar35],2);
                }
                break;
              }
            }
          }
          uVar19 = *(ushort *)&pMVar32->field_0xa7;
          if ((uVar19 >> 8 & 1) == 0) {
            pSVar18 = (cpi->common).seq_params;
            pMVar50 = pMVar52;
            if ((pSVar18->order_hint_info).enable_dist_wtd_comp != 0) {
              pMVar32 = *(pTVar39->mb).e_mbd.mi;
              pRVar29 = get_ref_frame_buf(cm,pMVar32->ref_frame[0]);
              pRVar30 = get_ref_frame_buf(cm,pMVar32->ref_frame[1]);
              uVar41 = 0;
              uVar24 = 0;
              if (pRVar29 != (RefCntBuffer *)0x0) {
                uVar24 = pRVar29->order_hint;
              }
              uVar31 = ((cpi->common).cur_frame)->order_hint;
              if (pRVar30 != (RefCntBuffer *)0x0) {
                uVar41 = pRVar30->order_hint;
              }
              oh = &pSVar18->order_hint_info;
              iVar21 = get_relative_dist(oh,uVar41,uVar31);
              pTVar39 = pTVar53;
              iVar20 = get_relative_dist(oh,uVar31,uVar24);
              pMVar32 = (pTVar39->mb).e_mbd.left_mbmi;
              pMVar50 = (pTVar39->mb).e_mbd.above_mbmi;
              if (pMVar50 == (MB_MODE_INFO *)0x0) {
                uVar35 = 0;
              }
              else if (pMVar50->ref_frame[1] < '\x01') {
                uVar35 = (ulong)(pMVar50->ref_frame[0] == '\a');
              }
              else {
                uVar35 = (ulong)(*(ushort *)&pMVar50->field_0xa7 >> 9 & 1);
              }
              if (pMVar32 == (MB_MODE_INFO *)0x0) {
                uVar28 = 0;
              }
              else if (pMVar32->ref_frame[1] < '\x01') {
                uVar28 = (ulong)(pMVar32->ref_frame[0] == '\a');
              }
              else {
                uVar28 = (ulong)(*(ushort *)&pMVar32->field_0xa7 >> 9 & 1);
              }
              iVar38 = -iVar21;
              if (0 < iVar21) {
                iVar38 = iVar21;
              }
              iVar21 = -iVar20;
              if (0 < iVar20) {
                iVar21 = iVar20;
              }
              pTVar53 = pTVar39;
              aom_write_symbol((aom_writer *)pMVar52,uVar19 >> 9 & 1,
                               pFVar15->compound_index_cdf
                               [uVar35 + uVar28 + (ulong)(iVar38 == iVar21) * 3],2);
              pMVar50 = pMVar52;
            }
          }
          else {
            iVar21 = is_interinter_compound_used('\x02',BVar6);
            pMVar50 = pMVar52;
            if (iVar21 != 0) {
              aom_write_symbol((aom_writer *)pMVar52,(pMVar32->interinter_comp).type - 2,
                               pFVar15->compound_type_cdf[BVar6],2);
            }
            if ((pMVar32->interinter_comp).type == '\x02') {
              aom_write_symbol((aom_writer *)pMVar52,(int)(pMVar32->interinter_comp).wedge_index,
                               pFVar15->wedge_idx_cdf[BVar6],0x10);
              aom_write_bit((aom_writer *)pMVar52,(int)(pMVar32->interinter_comp).wedge_sign);
            }
            else {
              aom_write_literal((aom_writer *)pMVar52,(uint)(pMVar32->interinter_comp).mask_type,1);
            }
          }
        }
      }
      pMVar32 = *(pTVar39->mb).e_mbd.mi;
      if (((pMVar32->field_0xa7 & 0x40) == 0) && (pMVar32->motion_mode != '\x02')) {
        pFVar17 = (pTVar53->mb).e_mbd.tile_ctx;
        if ((pMVar32->mode == '\x17') || (pMVar32->mode == '\x0f')) {
          bVar37 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [pMVar32->bsize];
          if ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
              [pMVar32->bsize] <
              "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
              [pMVar32->bsize]) {
            bVar37 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [pMVar32->bsize];
          }
          if (1 < bVar37) {
            lVar48 = 0;
            do {
              if ((ulong)('\0' < pMVar32->ref_frame[1]) + 1 == lVar48) goto LAB_0018be7e;
              pMVar3 = pMVar32->ref_frame + lVar48;
              lVar48 = lVar48 + 1;
            } while ((pTVar53->mb).e_mbd.global_motion[*pMVar3].wmtype != '\x01');
          }
        }
        if ((cpi->common).features.interp_filter == MULTITAP_SHARP2) {
          iVar21 = 0;
          do {
            if (iVar21 == 2) break;
            iVar20 = av1_get_pred_context_switchable_interp(xd_00,iVar21);
            bVar37 = (byte)((pMVar32->interp_filters).as_int >> 0x10);
            if (iVar21 == 0) {
              bVar37 = (byte)(pMVar32->interp_filters).as_int;
            }
            aom_write_symbol((aom_writer *)pMVar50,(uint)bVar37,
                             pFVar17->switchable_interp_cdf[iVar20],3);
            pTVar53->interp_filter_selected[bVar37] = pTVar53->interp_filter_selected[bVar37] + 1;
            iVar21 = iVar21 + 1;
          } while (((cpi->common).seq_params)->enable_dual_filter != '\0');
        }
      }
    }
  }
LAB_0018be7e:
  pTVar39 = pTVar53;
  for (uVar35 = 0; uVar35 < (ulong)(((cpi->common).seq_params)->monochrome == '\0') + 1;
      uVar35 = uVar35 + 1) {
    bVar37 = (pMVar16->palette_mode_info).palette_size[uVar35];
    pMVar32 = pMVar50;
    if (bVar37 != 0) {
      bVar45 = block_size_wide[pMVar16->bsize];
      iVar21 = (pTVar39->mb).e_mbd.mb_to_right_edge;
      bVar40 = (byte)(pTVar53->mb).e_mbd.plane[uVar35].subsampling_x;
      bVar9 = (byte)(pTVar53->mb).e_mbd.plane[uVar35].subsampling_y;
      bVar49 = uVar35 != 0;
      bVar10 = block_size_high[pMVar16->bsize];
      lVar48 = 0x294e;
      if (!bVar49) {
        lVar48 = 0x26d8;
      }
      iVar20 = (pTVar39->mb).e_mbd.mb_to_bottom_edge;
      pTVar47 = *local_40;
      iVar38 = 0x1f;
      uVar24 = (uint)bVar37;
      if (uVar24 != 0) {
        for (; bVar37 >> iVar38 == 0; iVar38 = iVar38 + -1) {
        }
      }
      uVar41 = (byte)*pTVar47 & 7;
      iVar22 = (1 << (-((byte)iVar38 ^ 0x1f) & 0x1f)) - uVar24;
      if (iVar22 <= (int)uVar41) {
        aom_write_literal((aom_writer *)pMVar50,((int)(uVar41 - iVar22) >> 1) + iVar22,iVar38);
        uVar41 = uVar41 - iVar22 & 1;
        iVar38 = 1;
      }
      aom_write_literal((aom_writer *)pMVar50,uVar41,iVar38);
      iVar21 = (((int)((iVar21 >> 0x1f & iVar21 >> 3) + (uint)bVar45) >> (bVar40 & 0x1f)) +
               (uint)(bVar45 >> (bVar40 & 0x1f) < 4 && bVar49) * 2) *
               (((int)((iVar20 >> 0x1f & iVar20 >> 3) + (uint)bVar10) >> (bVar9 & 0x1f)) +
               (uint)(bVar10 >> (bVar9 & 0x1f) < 4 && bVar49) * 2);
      if (iVar21 < 2) {
        iVar21 = 1;
      }
      while( true ) {
        iVar21 = iVar21 + -1;
        pTVar47 = pTVar47 + 1;
        if (iVar21 == 0) break;
        aom_write_symbol((aom_writer *)pMVar32,(byte)*pTVar47 & 7,
                         (aom_cdf_prob *)
                         ((long)pFVar15 +
                         (long)((char)*pTVar47 >> 4) * 0x12 + (ulong)uVar24 * 0x5a + lVar48 + -0xb4)
                         ,(uint)bVar37);
      }
      *local_40 = pTVar47;
    }
    pMVar50 = pMVar32;
  }
  bVar49 = true;
  if (-1 < (char)*(ushort *)&pMVar16->field_0xa7) {
    bVar49 = '\0' < pMVar16->ref_frame[0];
  }
  if (((bool)(pMVar16->skip_txfm != '\0' & bVar49 |
             ((BLOCK_SIZE)local_38 == BLOCK_4X4 || (cpi->common).features.tx_mode != '\x02'))) ||
     ((pTVar39->mb).e_mbd.lossless[*(ushort *)&pMVar16->field_0xa7 & 7] != 0)) {
    tx_size = pMVar16->tx_size;
    bVar5 = (pTVar39->mb).e_mbd.width;
    bVar37 = (pTVar39->mb).e_mbd.height;
    uVar24 = (uint)(byte)(pMVar16->skip_txfm != '\0' & bVar49);
  }
  else {
    if (bVar49) {
      uVar24 = get_vartx_max_txsize(xd_00,(BLOCK_SIZE)local_38,0);
      iVar21 = tx_size_high_unit[uVar24];
      iVar20 = tx_size_wide_unit[uVar24];
      for (iVar38 = 0; iVar38 < (int)local_48; iVar38 = iVar38 + iVar21) {
        for (iVar22 = 0; local_68 = (uint)bVar5, iVar22 < (int)local_68; iVar22 = iVar22 + iVar20) {
          pMVar32 = pMVar50;
          write_tx_size_vartx(xd_00,pMVar16,(TX_SIZE)uVar24,0,iVar38,iVar22,(aom_writer *)pMVar50);
          in_stack_fffffffffffffee8 = pMVar50;
          pMVar50 = pMVar32;
        }
      }
      goto LAB_0018c118;
    }
    pMVar32 = *(pTVar39->mb).e_mbd.mi;
    uVar35 = (ulong)pMVar32->bsize;
    pTVar54 = pTVar39;
    if (uVar35 != 0) {
      bVar5 = ""[uVar35];
      uVar24 = (uint)bVar5;
      _Var7 = (pTVar39->mb).e_mbd.up_available;
      _Var12 = (pTVar39->mb).e_mbd.left_available;
      bVar37 = *(pTVar39->mb).e_mbd.above_txfm_context;
      if ((_Var7 == true) &&
         ((pMVar52 = (pTVar39->mb).e_mbd.above_mbmi, (pMVar52->field_0xa7 & 0x80) != 0 ||
          ('\0' < pMVar52->ref_frame[0])))) {
        bVar37 = block_size_wide[pMVar52->bsize];
      }
      bVar45 = *(pTVar39->mb).e_mbd.left_txfm_context;
      if ((_Var12 != false) &&
         ((pMVar52 = (pTVar39->mb).e_mbd.left_mbmi, (pMVar52->field_0xa7 & 0x80) != 0 ||
          ('\0' < pMVar52->ref_frame[0])))) {
        bVar45 = block_size_high[pMVar52->bsize];
      }
      iVar21 = 0;
      for (; bVar5 != pMVar32->tx_size; bVar5 = ""[bVar5]) {
        iVar21 = iVar21 + 1;
      }
      aom_write_symbol((aom_writer *)pMVar50,iVar21,
                       ((pTVar39->mb).e_mbd.tile_ctx)->tx_size_cdf
                       [(ulong)(byte)bsize_to_tx_size_cat_bsize_to_tx_size_depth_table[uVar35] - 1]
                       [(uint)(byte)(_Var7 & *(int *)((long)tx_size_wide + (ulong)(uVar24 * 4)) <=
                                             (int)(uint)bVar37) +
                        (uint)(byte)(_Var12 & *(int *)((long)tx_size_high + (ulong)(uVar24 * 4)) <=
                                              (int)(uint)bVar45)],
                       (byte)bsize_to_max_depth_bsize_to_max_depth_table[uVar35] + 1);
    }
    tx_size = pMVar16->tx_size;
    bVar5 = (pTVar39->mb).e_mbd.width;
    bVar37 = (pTVar39->mb).e_mbd.height;
    uVar24 = 0;
    pTVar39 = pTVar54;
  }
  set_txfm_ctxs(tx_size,(uint)bVar5,(uint)bVar37,uVar24,xd_00);
LAB_0018c118:
  if (pMVar16->skip_txfm == '\0') {
    iVar21 = aom_tell_size((aom_writer *)pMVar50);
    local_50 = CONCAT44(local_50._4_4_,iVar21);
    pMVar16 = *(pTVar39->mb).e_mbd.mi;
    BVar6 = pMVar16->bsize;
    if (((pMVar16->field_0xa7 & 0x80) == 0) && (pMVar16->ref_frame[0] < '\x01')) {
      av1_write_intra_coeffs_mb(cm,&pTVar39->mb,(aom_writer *)pMVar50,BVar6);
    }
    else {
      local_58 = 0;
      _ref_mv = 0;
      bVar37 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar6];
      bVar5 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar6];
      uVar41 = 0x10;
      uVar24 = uVar41;
      if (bVar37 < 0x10) {
        uVar24 = (uint)bVar37;
      }
      local_48 = CONCAT44(local_48._4_4_,uVar24);
      local_38 = CONCAT44(local_38._4_4_,(uint)bVar5);
      if (bVar5 < 0x10) {
        uVar41 = (uint)bVar5;
      }
      uVar11 = ((cpi->common).seq_params)->monochrome;
      pTVar54 = pTVar39;
      for (uVar24 = 0; uVar24 < (uint)local_38; uVar24 = uVar24 + uVar41) {
        for (uVar31 = 0; uVar31 < bVar37; uVar31 = uVar31 + (int)local_48) {
          uVar35 = 0;
          pTVar39 = pTVar54;
          while ((uVar35 != (ulong)(uVar11 == '\0') * 2 + 1 &&
                 ((uVar35 == 0 || ((pTVar39->mb).e_mbd.is_chroma_ref == true))))) {
            iVar21 = (pTVar53->mb).e_mbd.plane[uVar35].subsampling_x;
            iVar20 = (pTVar53->mb).e_mbd.plane[uVar35].subsampling_y;
            BVar6 = av1_ss_size_lookup[pMVar16->bsize][iVar21][iVar20];
            uVar42 = get_vartx_max_txsize(xd_00,BVar6,(int)uVar35);
            local_40 = (TokenExtra **)CONCAT44(local_40._4_4_,uVar42);
            iVar38 = tx_size_wide_unit[uVar42];
            iVar22 = tx_size_high_unit[uVar42];
            BVar13 = av1_ss_size_lookup[0xc][iVar21][iVar20];
            uVar42 = uVar24 >> ((byte)iVar20 & 0x1f);
            uVar43 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [BVar13] + uVar42;
            if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                           [BVar6] <= (int)uVar43) {
              uVar43 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                             [BVar6];
            }
            aVar23 = uVar31 >> ((byte)iVar21 & 0x1f);
            uVar46 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [BVar13] + aVar23;
            if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [BVar6] <= (int)uVar46) {
              uVar46 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                             [BVar6];
            }
            for (; bit_depth = aVar23, (int)uVar42 < (int)uVar43; uVar42 = uVar42 + iVar22) {
              for (; (int)bit_depth < (int)uVar46; bit_depth = bit_depth + iVar38) {
                plane = (&ref_mv)[uVar35].as_int;
                in_stack_fffffffffffffee8 =
                     (MB_MODE_INFO *)
                     CONCAT44((int)((ulong)in_stack_fffffffffffffee8 >> 0x20),(uint)BVar6);
                pack_txb_tokens((aom_writer *)pMVar50,cm,&pTVar39->mb,(TokenExtra **)xd_00,
                                (TokenExtra *)pMVar16,(MACROBLOCKD *)(uVar35 & 0xffffffff),
                                in_stack_fffffffffffffee8,plane,(BLOCK_SIZE)uVar42,bit_depth,
                                (uint)(byte)local_40,in_stack_ffffffffffffff10,(int)pMVar50,
                                (TX_SIZE)pTVar39,(TOKEN_STATS *)xd_00);
                (&ref_mv)[uVar35].as_int = plane + iVar22 * iVar38;
              }
            }
            uVar35 = uVar35 + 1;
          }
          pTVar54 = pTVar39;
        }
      }
    }
    iVar21 = aom_tell_size((aom_writer *)pMVar50);
    pTVar39->coefficient_size = pTVar39->coefficient_size + (iVar21 - (int)local_50);
  }
  return;
}

Assistant:

static inline void write_modes_b(AV1_COMP *cpi, ThreadData *const td,
                                 const TileInfo *const tile, aom_writer *w,
                                 const TokenExtra **tok,
                                 const TokenExtra *const tok_end, int mi_row,
                                 int mi_col) {
  const AV1_COMMON *cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  MACROBLOCKD *xd = &td->mb.e_mbd;
  FRAME_CONTEXT *tile_ctx = xd->tile_ctx;
  const int grid_idx = mi_row * mi_params->mi_stride + mi_col;
  xd->mi = mi_params->mi_grid_base + grid_idx;
  td->mb.mbmi_ext_frame =
      cpi->mbmi_ext_info.frame_base +
      get_mi_ext_idx(mi_row, mi_col, cm->mi_params.mi_alloc_bsize,
                     cpi->mbmi_ext_info.stride);
  xd->tx_type_map = mi_params->tx_type_map + grid_idx;
  xd->tx_type_map_stride = mi_params->mi_stride;

  const MB_MODE_INFO *mbmi = xd->mi[0];
  const BLOCK_SIZE bsize = mbmi->bsize;
  assert(bsize <= cm->seq_params->sb_size ||
         (bsize >= BLOCK_SIZES && bsize < BLOCK_SIZES_ALL));

  const int bh = mi_size_high[bsize];
  const int bw = mi_size_wide[bsize];
  set_mi_row_col(xd, tile, mi_row, bh, mi_col, bw, mi_params->mi_rows,
                 mi_params->mi_cols);

  xd->above_txfm_context = cm->above_contexts.txfm[tile->tile_row] + mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);

  write_mbmi_b(cpi, td, w);

  for (int plane = 0; plane < AOMMIN(2, av1_num_planes(cm)); ++plane) {
    const uint8_t palette_size_plane =
        mbmi->palette_mode_info.palette_size[plane];
    assert(!mbmi->skip_mode || !palette_size_plane);
    if (palette_size_plane > 0) {
      assert(mbmi->use_intrabc == 0);
      assert(av1_allow_palette(cm->features.allow_screen_content_tools,
                               mbmi->bsize));
      assert(!plane || xd->is_chroma_ref);
      int rows, cols;
      av1_get_block_dimensions(mbmi->bsize, plane, xd, NULL, NULL, &rows,
                               &cols);
      assert(*tok < tok_end);
      MapCdf map_pb_cdf = plane ? tile_ctx->palette_uv_color_index_cdf
                                : tile_ctx->palette_y_color_index_cdf;
      pack_map_tokens(w, tok, palette_size_plane, rows * cols, map_pb_cdf);
    }
  }

  const int is_inter_tx = is_inter_block(mbmi);
  const int skip_txfm = mbmi->skip_txfm;
  const uint8_t segment_id = mbmi->segment_id;
  if (cm->features.tx_mode == TX_MODE_SELECT && block_signals_txsize(bsize) &&
      !(is_inter_tx && skip_txfm) && !xd->lossless[segment_id]) {
    if (is_inter_tx) {  // This implies skip flag is 0.
      const TX_SIZE max_tx_size = get_vartx_max_txsize(xd, bsize, 0);
      const int txbh = tx_size_high_unit[max_tx_size];
      const int txbw = tx_size_wide_unit[max_tx_size];
      const int width = mi_size_wide[bsize];
      const int height = mi_size_high[bsize];
      for (int idy = 0; idy < height; idy += txbh) {
        for (int idx = 0; idx < width; idx += txbw) {
          write_tx_size_vartx(xd, mbmi, max_tx_size, 0, idy, idx, w);
        }
      }
    } else {
      write_selected_tx_size(xd, w);
      set_txfm_ctxs(mbmi->tx_size, xd->width, xd->height, 0, xd);
    }
  } else {
    set_txfm_ctxs(mbmi->tx_size, xd->width, xd->height,
                  skip_txfm && is_inter_tx, xd);
  }

  if (!mbmi->skip_txfm) {
    int start = aom_tell_size(w);

    write_tokens_b(cpi, &td->mb, w, tok, tok_end);

    const int end = aom_tell_size(w);
    td->coefficient_size += end - start;
  }
}